

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMouseViewportEvent(ImGuiIO *this,ImGuiID viewport_id)

{
  ImGuiInputEvent local_18;
  
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x589,"void ImGuiIO::AddMouseViewportEvent(ImGuiID)");
  }
  if (((GImGui->IO).BackendFlags & 0x800) != 0) {
    local_18.AddedByTestEngine = false;
    local_18._21_3_ = 0;
    local_18.field_2._4_8_ = 0;
    local_18.Type = ImGuiInputEventType_MouseViewport;
    local_18.Source = ImGuiInputSource_Mouse;
    local_18.field_2.MouseButton.Button = viewport_id;
    ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
    return;
  }
  __assert_fail("g.IO.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x58a,"void ImGuiIO::AddMouseViewportEvent(ImGuiID)");
}

Assistant:

void ImGuiIO::AddMouseViewportEvent(ImGuiID viewport_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport);

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseViewport;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseViewport.HoveredViewportID = viewport_id;
    g.InputEventsQueue.push_back(e);
}